

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QDockWidgetGroupWindow::childEvent(QDockWidgetGroupWindow *this,QChildEvent *event)

{
  QObject *pQVar1;
  
  if (*(short *)(event + 8) == 0x44) {
    pQVar1 = (QObject *)
             QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(*(QObject **)(event + 0x10));
    if (pQVar1 != (QObject *)0x0) {
      QObject::installEventFilter(pQVar1);
      return;
    }
  }
  else if (*(short *)(event + 8) == 0x47) {
    pQVar1 = (QObject *)
             QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(*(QObject **)(event + 0x10));
    if (pQVar1 != (QObject *)0x0) {
      QObject::removeEventFilter(pQVar1);
    }
    destroyIfSingleItemLeft(this);
    return;
  }
  return;
}

Assistant:

void QDockWidgetGroupWindow::childEvent(QChildEvent *event)
{
    switch (event->type()) {
    case QEvent::ChildRemoved:
        if (auto *dockWidget = qobject_cast<QDockWidget *>(event->child()))
            dockWidget->removeEventFilter(this);
        destroyIfSingleItemLeft();
        break;
    case QEvent::ChildAdded:
        if (auto *dockWidget = qobject_cast<QDockWidget *>(event->child()))
            dockWidget->installEventFilter(this);
        break;
    default:
        break;
    }
}